

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<long_double>::Fill(TPZVec<long_double> *this,longdouble *copy,int64_t from,int64_t numelem)

{
  ostream *poVar1;
  long lVar2;
  longdouble *plVar3;
  long lVar4;
  long lVar5;
  
  if (numelem < -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"TPZVec::Fill",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    poVar1 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"It\'s negative parameter numelem, then numelem = ",0x30);
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::ostream::flush();
  }
  lVar4 = 0;
  if (0 < from) {
    lVar4 = from;
  }
  lVar2 = this->fNElements;
  if (numelem < 0) {
    numelem = lVar2;
  }
  lVar5 = numelem + from;
  if (lVar2 <= numelem + from) {
    lVar5 = lVar2;
  }
  if (lVar4 < lVar5) {
    if (lVar4 < lVar2) {
      lVar2 = lVar4;
    }
    lVar5 = lVar5 - lVar2;
    plVar3 = this->fStore + lVar2;
    do {
      *plVar3 = *copy;
      plVar3 = plVar3 + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  return;
}

Assistant:

void TPZVec<T>::Fill(const T& copy, const int64_t from, const int64_t numelem){
#ifndef PZNODEBUG
	if(numelem<0 && numelem != -1) {
		PZError << "TPZVec::Fill" << std::endl
		<< "It's negative parameter numelem, then numelem = "
		<< fNElements << std::endl;
		
		PZError.flush();
	}
#endif
	
	int64_t first = (from < 0) ? 0 : from;
	int64_t nel = numelem;
	first = (first > fNElements) ? fNElements : first;
	if (nel < 0) nel = fNElements;
	int64_t last = (from+nel > fNElements) ? fNElements : from+nel;
	
	for(int64_t i=first; i<last; i++)
		fStore[i] = copy;
}